

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

csubstr __thiscall c4::yml::Parser::_scan_squot_scalar(Parser *this)

{
  code *pcVar1;
  Location LVar2;
  Location LVar3;
  Location LVar4;
  Location LVar5;
  Location LVar6;
  Location LVar7;
  Location LVar8;
  Location LVar9;
  Location LVar10;
  uint uVar11;
  bool bVar12;
  char cVar13;
  bool bVar14;
  ulong uVar15;
  State *pSVar16;
  long lVar17;
  size_t sVar18;
  char *pcVar19;
  byte bVar20;
  basic_substring<char> *pbVar21;
  ulong uVar22;
  ulong uVar24;
  ulong uVar25;
  long lVar26;
  byte bVar27;
  csubstr cVar28;
  basic_substring<char> bVar29;
  char msg [41];
  basic_substring<char> local_1e8;
  basic_substring<char> local_1d8;
  char local_1c8 [48];
  undefined4 local_198;
  undefined1 local_194;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  char *pcStack_178;
  undefined8 local_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  char *pcStack_150;
  undefined8 local_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  char *pcStack_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  char *pcStack_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  char *pcStack_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  char *pcStack_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  char *pcStack_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  char *pcStack_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  char *pcStack_38;
  undefined8 local_30;
  ulong uVar23;
  
  bVar27 = 0;
  uVar15 = (this->m_state->pos).super_LineCol.offset;
  uVar24 = (this->m_buf).len;
  if (uVar24 < uVar15) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar12 = is_debugger_attached(), bVar12)) {
      pcVar1 = (code *)swi(3);
      cVar28 = (csubstr)(*pcVar1)();
      return cVar28;
    }
    handle_error(0x2467aa,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x1533,"first >= 0 && first <= len");
  }
  basic_substring<char>::basic_substring(&local_1d8,(this->m_buf).str + uVar15,uVar24 - uVar15);
  local_1e8 = local_1d8;
  if (local_1d8.len == 0) {
    sVar18 = (this->m_state->pos).super_LineCol.offset;
  }
  else {
    cVar13 = *local_1d8.str;
    if (cVar13 == ' ') {
      local_1e8 = basic_substring<char>::triml(&local_1e8,' ');
      uVar24 = (this->m_buf).len;
      if (uVar24 < uVar15) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar12 = is_debugger_attached(), bVar12)) {
          pcVar1 = (code *)swi(3);
          cVar28 = (csubstr)(*pcVar1)();
          return cVar28;
        }
        handle_error(0x2467aa,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x1533,"first >= 0 && first <= len");
      }
      basic_substring<char>::basic_substring(&local_1d8,(this->m_buf).str + uVar15,uVar24 - uVar15);
      if (local_1d8.len == 0) {
        if ((local_1e8.len != 0) ||
           (pcVar19 = local_1d8.str, local_1d8.str == (char *)0x0 || local_1d8.str != local_1e8.str)
           ) goto LAB_00224d73;
      }
      else {
        pcVar19 = local_1e8.str;
        if (local_1e8.str < local_1d8.str ||
            local_1d8.str + local_1d8.len < local_1e8.str + local_1e8.len) {
LAB_00224d73:
          builtin_strncpy(local_1c8 + 0x10,"uper(s))",9);
          builtin_strncpy(local_1c8,"_buf.sub(b).is_s",0x10);
          local_1d8.len._0_1_ = 'i';
          local_1d8.len._1_1_ = 'l';
          local_1d8.len._2_1_ = 'e';
          local_1d8.len._3_1_ = 'd';
          local_1d8.len._4_1_ = ':';
          local_1d8.len._5_1_ = ' ';
          local_1d8.len._6_1_ = '(';
          local_1d8.len._7_1_ = 'm';
          local_1d8.str = (char *)0x6166206b63656863;
          if ((((byte)s_error_flags & 1) != 0) && (bVar12 = is_debugger_attached(), bVar12)) {
            pcVar1 = (code *)swi(3);
            cVar28 = (csubstr)(*pcVar1)();
            return cVar28;
          }
          local_50 = 0;
          uStack_48 = 0x7a14;
          local_40 = 0;
          pcStack_38 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_30 = 0x65;
          LVar2.super_LineCol.col = 0;
          LVar2.super_LineCol.offset = SUB168(ZEXT816(0x7a14) << 0x40,0);
          LVar2.super_LineCol.line = SUB168(ZEXT816(0x7a14) << 0x40,8);
          LVar2.name.str =
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          LVar2.name.len = 0x65;
          (*(this->m_stack).m_callbacks.m_error)
                    ((char *)&local_1d8,0x29,LVar2,(this->m_stack).m_callbacks.m_user_data);
          pcVar19 = local_1e8.str;
        }
      }
      uVar24 = (this->m_buf).len;
      if (uVar24 < uVar15) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar12 = is_debugger_attached(), bVar12)) {
          pcVar1 = (code *)swi(3);
          cVar28 = (csubstr)(*pcVar1)();
          return cVar28;
        }
        handle_error(0x2467aa,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x1533,"first >= 0 && first <= len");
      }
      basic_substring<char>::basic_substring(&local_1d8,(this->m_buf).str + uVar15,uVar24 - uVar15);
      if (pcVar19 < local_1d8.str) {
        builtin_strncpy(local_1c8 + 0x10,"f.sub(b).begin())",0x12);
        builtin_strncpy(local_1c8,".begin() >= m_bu",0x10);
        local_1d8.len._0_1_ = 'i';
        local_1d8.len._1_1_ = 'l';
        local_1d8.len._2_1_ = 'e';
        local_1d8.len._3_1_ = 'd';
        local_1d8.len._4_1_ = ':';
        local_1d8.len._5_1_ = ' ';
        local_1d8.len._6_1_ = '(';
        local_1d8.len._7_1_ = 's';
        local_1d8.str = (char *)0x6166206b63656863;
        if ((((byte)s_error_flags & 1) != 0) && (bVar12 = is_debugger_attached(), bVar12)) {
          pcVar1 = (code *)swi(3);
          cVar28 = (csubstr)(*pcVar1)();
          return cVar28;
        }
        local_78 = 0;
        uStack_70 = 0x7a15;
        local_68 = 0;
        pcStack_60 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_58 = 0x65;
        LVar3.super_LineCol.col = 0;
        LVar3.super_LineCol.offset = SUB168(ZEXT816(0x7a15) << 0x40,0);
        LVar3.super_LineCol.line = SUB168(ZEXT816(0x7a15) << 0x40,8);
        LVar3.name.str =
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        LVar3.name.len = 0x65;
        (*(this->m_stack).m_callbacks.m_error)
                  ((char *)&local_1d8,0x32,LVar3,(this->m_stack).m_callbacks.m_user_data);
      }
      pcVar19 = local_1e8.str;
      uVar24 = (this->m_buf).len;
      if (uVar24 < uVar15) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar12 = is_debugger_attached(), bVar12)) {
          pcVar1 = (code *)swi(3);
          cVar28 = (csubstr)(*pcVar1)();
          return cVar28;
        }
        handle_error(0x2467aa,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x1533,"first >= 0 && first <= len");
      }
      basic_substring<char>::basic_substring(&local_1d8,(this->m_buf).str + uVar15,uVar24 - uVar15);
      _line_progressed(this,(long)pcVar19 - (long)local_1d8.str);
      sVar18 = (this->m_state->pos).super_LineCol.offset;
      if (local_1e8.len == 0) goto LAB_00224f7d;
      cVar13 = *local_1e8.str;
    }
    else {
      sVar18 = (this->m_state->pos).super_LineCol.offset;
    }
    if (cVar13 == '\'') goto LAB_00225029;
  }
LAB_00224f7d:
  builtin_strncpy(local_1c8,".begins_with(\'\\\'\'))",0x14);
  local_1d8.len._0_1_ = 'i';
  local_1d8.len._1_1_ = 'l';
  local_1d8.len._2_1_ = 'e';
  local_1d8.len._3_1_ = 'd';
  local_1d8.len._4_1_ = ':';
  local_1d8.len._5_1_ = ' ';
  local_1d8.len._6_1_ = '(';
  local_1d8.len._7_1_ = 's';
  local_1d8.str = (char *)0x6166206b63656863;
  if ((((byte)s_error_flags & 1) != 0) && (bVar12 = is_debugger_attached(), bVar12)) {
    pcVar1 = (code *)swi(3);
    cVar28 = (csubstr)(*pcVar1)();
    return cVar28;
  }
  local_a0 = 0;
  uStack_98 = 0x7a19;
  local_90 = 0;
  pcStack_88 = 
  "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
  ;
  local_80 = 0x65;
  LVar4.super_LineCol.col = 0;
  LVar4.super_LineCol.offset = SUB168(ZEXT816(0x7a19) << 0x40,0);
  LVar4.super_LineCol.line = SUB168(ZEXT816(0x7a19) << 0x40,8);
  LVar4.name.str =
       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
  ;
  LVar4.name.len = 0x65;
  (*(this->m_stack).m_callbacks.m_error)
            ((char *)&local_1d8,0x24,LVar4,(this->m_stack).m_callbacks.m_user_data);
LAB_00225029:
  _line_progressed(this,1);
  if (local_1e8.len == 0) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar12 = is_debugger_attached(), bVar12)) {
      pcVar1 = (code *)swi(3);
      cVar28 = (csubstr)(*pcVar1)();
      return cVar28;
    }
    handle_error(0x2467aa,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x1533,"first >= 0 && first <= len");
  }
  basic_substring<char>::basic_substring(&local_1d8,local_1e8.str + 1,local_1e8.len - 1);
  local_1e8 = local_1d8;
  pSVar16 = this->m_state;
  uVar15 = (this->m_buf).len;
  if ((pSVar16->pos).super_LineCol.offset < uVar15) {
    uVar24 = 1;
    bVar12 = false;
    do {
      uVar25 = (pSVar16->line_contents).rem.len;
      if (uVar25 == 0) {
        bVar12 = true;
      }
      else {
        pcVar19 = (pSVar16->line_contents).rem.str;
        bVar20 = 1;
        uVar22 = 0;
        do {
          uVar23 = uVar22;
          bVar14 = bVar12;
          if (pcVar19[uVar22] != ' ') {
            if (pcVar19[uVar22] == '\'') {
              uVar23 = uVar22 + 1;
              if ((uVar25 <= uVar23) || (bVar14 = true, pcVar19[uVar23] != '\'')) goto LAB_002250e1;
            }
            else {
              bVar20 = 0;
            }
          }
          bVar12 = bVar14;
          uVar22 = uVar23 + 1;
        } while (uVar22 < uVar25);
        uVar22 = 0xffffffffffffffff;
LAB_002250e1:
        bVar14 = (bool)(bVar20 | bVar12);
        bVar12 = true;
        if (!bVar14 && uVar24 < 2) {
          bVar12 = false;
          if ((uVar25 != 0) && (bVar12 = false, pcVar19 == (pSVar16->line_contents).full.str)) {
            bVar12 = *pcVar19 == ' ';
          }
        }
        if (uVar22 != 0xffffffffffffffff) {
          if (uVar15 <= uVar22) {
            builtin_strncpy(local_1c8 + 0x10," m_buf.len)",0xc);
            builtin_strncpy(local_1c8,"os >= 0 && pos <",0x10);
            local_1d8.len._0_1_ = 'i';
            local_1d8.len._1_1_ = 'l';
            local_1d8.len._2_1_ = 'e';
            local_1d8.len._3_1_ = 'd';
            local_1d8.len._4_1_ = ':';
            local_1d8.len._5_1_ = ' ';
            local_1d8.len._6_1_ = '(';
            local_1d8.len._7_1_ = 'p';
            local_1d8.str = (char *)0x6166206b63656863;
            if ((((byte)s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
              pcVar1 = (code *)swi(3);
              cVar28 = (csubstr)(*pcVar1)();
              return cVar28;
            }
            local_c8 = 0;
            uStack_c0 = 0x7a4c;
            local_b8 = 0;
            pcStack_b0 = 
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            local_a8 = 0x65;
            LVar6.super_LineCol.col = 0;
            LVar6.super_LineCol.offset = SUB168(ZEXT816(0x7a4c) << 0x40,0);
            LVar6.super_LineCol.line = SUB168(ZEXT816(0x7a4c) << 0x40,8);
            LVar6.name.str =
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            LVar6.name.len = 0x65;
            (*(this->m_stack).m_callbacks.m_error)
                      ((char *)&local_1d8,0x2c,LVar6,(this->m_stack).m_callbacks.m_user_data);
            pSVar16 = this->m_state;
            uVar15 = (this->m_buf).len;
          }
          uVar24 = (pSVar16->pos).super_LineCol.offset + uVar22;
          if (uVar15 <= uVar24) {
            if ((((byte)s_error_flags & 1) != 0) && (bVar12 = is_debugger_attached(), bVar12)) {
              pcVar1 = (code *)swi(3);
              cVar28 = (csubstr)(*pcVar1)();
              return cVar28;
            }
            handle_error(0x2467aa,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x14c3,"i >= 0 && i < len");
          }
          if ((this->m_buf).str[uVar24] != '\'') {
            builtin_strncpy(local_1c8 + 0x10,"s.offset + pos] == \'\\\'\')",0x19);
            builtin_strncpy(local_1c8,"_buf[m_state->po",0x10);
            local_1d8.len._0_1_ = 'i';
            local_1d8.len._1_1_ = 'l';
            local_1d8.len._2_1_ = 'e';
            local_1d8.len._3_1_ = 'd';
            local_1d8.len._4_1_ = ':';
            local_1d8.len._5_1_ = ' ';
            local_1d8.len._6_1_ = '(';
            local_1d8.len._7_1_ = 'm';
            local_1d8.str = (char *)0x6166206b63656863;
            if ((((byte)s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
              pcVar1 = (code *)swi(3);
              cVar28 = (csubstr)(*pcVar1)();
              return cVar28;
            }
            local_f0 = 0;
            uStack_e8 = 0x7a4d;
            local_e0 = 0;
            pcStack_d8 = 
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            local_d0 = 0x65;
            LVar7.super_LineCol.col = 0;
            LVar7.super_LineCol.offset = SUB168(ZEXT816(0x7a4d) << 0x40,0);
            LVar7.super_LineCol.line = SUB168(ZEXT816(0x7a4d) << 0x40,8);
            LVar7.name.str =
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            LVar7.name.len = 0x65;
            (*(this->m_stack).m_callbacks.m_error)
                      ((char *)&local_1d8,0x39,LVar7,(this->m_stack).m_callbacks.m_user_data);
          }
          _line_progressed(this,uVar22 + 1);
          lVar26 = ~sVar18 + (this->m_state->pos).super_LineCol.offset;
          if (lVar26 == 0) {
            local_1d8.len._0_1_ = 'i';
            local_1d8.len._1_1_ = 'l';
            local_1d8.len._2_1_ = 'e';
            local_1d8.len._3_1_ = 'd';
            local_1d8.len._4_1_ = ':';
            local_1d8.len._5_1_ = ' ';
            local_1d8.len._6_1_ = '(';
            local_1d8.len._7_1_ = 'p';
            local_1d8.str = (char *)0x6166206b63656863;
            builtin_strncpy(local_1c8,"os > 0)",8);
            if ((((byte)s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
              pcVar1 = (code *)swi(3);
              cVar28 = (csubstr)(*pcVar1)();
              return cVar28;
            }
            local_118 = 0;
            uStack_110 = 0x7a5d;
            local_108 = 0;
            pcStack_100 = 
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            local_f8 = 0x65;
            LVar8.super_LineCol.col = 0;
            LVar8.super_LineCol.offset = SUB168(ZEXT816(0x7a5d) << 0x40,0);
            LVar8.super_LineCol.line = SUB168(ZEXT816(0x7a5d) << 0x40,8);
            LVar8.name.str =
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            LVar8.name.len = 0x65;
            (*(this->m_stack).m_callbacks.m_error)
                      ((char *)&local_1d8,0x18,LVar8,(this->m_stack).m_callbacks.m_user_data);
          }
          else if (lVar26 == -1) break;
          pcVar19 = (this->m_buf).str;
          sVar18 = (this->m_buf).len;
          if (pcVar19 + sVar18 < local_1e8.str + local_1e8.len ||
              local_1e8.str + local_1e8.len < pcVar19) {
            pcVar19 = "check failed: (s.end() >= m_buf.begin() && s.end() <= m_buf.end())";
            pbVar21 = &local_1d8;
            for (lVar17 = 8; lVar17 != 0; lVar17 = lVar17 + -1) {
              pbVar21->str = *(char **)pcVar19;
              pcVar19 = pcVar19 + ((ulong)bVar27 * -2 + 1) * 8;
              pbVar21 = (basic_substring<char> *)&pbVar21[-(ulong)bVar27].len;
            }
            uVar11 = (uint)local_198 >> 0x10;
            local_198 = CONCAT22((ushort)uVar11 & 0xff00,0x2929);
            if ((((byte)s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
              pcVar1 = (code *)swi(3);
              cVar28 = (csubstr)(*pcVar1)();
              return cVar28;
            }
            local_140 = 0;
            uStack_138 = 0x7a5e;
            local_130 = 0;
            pcStack_128 = 
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            local_120 = 0x65;
            LVar9.super_LineCol.col = 0;
            LVar9.super_LineCol.offset = SUB168(ZEXT816(0x7a5e) << 0x40,0);
            LVar9.super_LineCol.line = SUB168(ZEXT816(0x7a5e) << 0x40,8);
            LVar9.name.str =
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            LVar9.name.len = 0x65;
            (*(this->m_stack).m_callbacks.m_error)
                      ((char *)&local_1d8,0x43,LVar9,(this->m_stack).m_callbacks.m_user_data);
            pcVar19 = (this->m_buf).str;
            sVar18 = (this->m_buf).len;
          }
          uVar15 = local_1e8.len;
          if ((local_1e8.str + local_1e8.len != pcVar19 + sVar18) &&
             (local_1e8.str[local_1e8.len] != '\'')) {
            builtin_strncpy(local_1c8 + 0x10,"end() || *s.end() == \'\\\'\')",0x1b);
            builtin_strncpy(local_1c8,".end() == m_buf.",0x10);
            local_1d8.len._0_1_ = 'i';
            local_1d8.len._1_1_ = 'l';
            local_1d8.len._2_1_ = 'e';
            local_1d8.len._3_1_ = 'd';
            local_1d8.len._4_1_ = ':';
            local_1d8.len._5_1_ = ' ';
            local_1d8.len._6_1_ = '(';
            local_1d8.len._7_1_ = 's';
            local_1d8.str = (char *)0x6166206b63656863;
            if ((((byte)s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
              pcVar1 = (code *)swi(3);
              cVar28 = (csubstr)(*pcVar1)();
              return cVar28;
            }
            local_168 = 0;
            uStack_160 = 0x7a5f;
            local_158 = 0;
            pcStack_150 = 
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            local_148 = 0x65;
            LVar10.super_LineCol.col = 0;
            LVar10.super_LineCol.offset = SUB168(ZEXT816(0x7a5f) << 0x40,0);
            LVar10.super_LineCol.line = SUB168(ZEXT816(0x7a5f) << 0x40,8);
            LVar10.name.str =
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            LVar10.name.len = 0x65;
            (*(this->m_stack).m_callbacks.m_error)
                      ((char *)&local_1d8,0x3b,LVar10,(this->m_stack).m_callbacks.m_user_data);
            uVar15 = local_1e8.len;
          }
          uVar24 = lVar26 - 1;
          if ((lVar26 != 0) && (uVar15 < uVar24)) {
            if ((((byte)s_error_flags & 1) != 0) && (bVar12 = is_debugger_attached(), bVar12)) {
              pcVar1 = (code *)swi(3);
              cVar28 = (csubstr)(*pcVar1)();
              return cVar28;
            }
            handle_error(0x2467aa,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x153b,"(num >= 0 && num <= len) || (num == npos)");
          }
          uVar25 = uVar24;
          if (lVar26 == 0) {
            uVar25 = uVar15;
          }
          if ((uVar24 != 0) && (uVar15 < uVar25)) {
            if ((((byte)s_error_flags & 1) != 0) && (bVar12 = is_debugger_attached(), bVar12)) {
              pcVar1 = (code *)swi(3);
              cVar28 = (csubstr)(*pcVar1)();
              return cVar28;
            }
            handle_error(0x2467aa,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x153d,"(first >= 0 && first + rnum <= len) || (num == 0)");
          }
          basic_substring<char>::basic_substring(&local_1d8,local_1e8.str,uVar25);
          local_1e8 = local_1d8;
          goto LAB_00225177;
        }
      }
      _line_progressed(this,uVar25);
      uVar24 = uVar24 + 1;
      _line_ended(this);
      _scan_line(this);
      pSVar16 = this->m_state;
      uVar15 = (this->m_buf).len;
    } while ((pSVar16->pos).super_LineCol.offset < uVar15);
  }
  else {
    bVar12 = false;
  }
  bVar14 = is_debugger_attached();
  if ((bVar14) && (bVar14 = is_debugger_attached(), bVar14)) {
    pcVar1 = (code *)swi(3);
    cVar28 = (csubstr)(*pcVar1)();
    return cVar28;
  }
  cVar28.len = 0x3a;
  cVar28.str = "ERROR: reached end of file while looking for closing quote";
  _err<>(this,cVar28);
LAB_00225177:
  cVar28 = (csubstr)local_1e8;
  if (bVar12) {
    cVar28 = _filter_squot_scalar(this,local_1e8);
    if (((local_1e8.len < cVar28.len) && (local_1e8.len != 0)) && (local_1e8.str != (char *)0x0)) {
      local_1d8 = basic_substring<char>::triml(&local_1e8,' ');
      bVar29 = basic_substring<char>::trimr(&local_1d8,' ');
      if (bVar29.str != (char *)0x0 && bVar29.len != 0) {
        pcVar19 = "check failed: (ret.len <= s.len || s.empty() || s.trim(\' \').empty())";
        pbVar21 = &local_1d8;
        for (lVar26 = 8; lVar26 != 0; lVar26 = lVar26 + -1) {
          pbVar21->str = *(char **)pcVar19;
          pcVar19 = pcVar19 + ((ulong)bVar27 * -2 + 1) * 8;
          pbVar21 = (basic_substring<char> *)&pbVar21[-(ulong)bVar27].len;
        }
        local_194 = 0;
        local_198 = 0x29292879;
        if ((((byte)s_error_flags & 1) != 0) && (bVar12 = is_debugger_attached(), bVar12)) {
          pcVar1 = (code *)swi(3);
          cVar28 = (csubstr)(*pcVar1)();
          return cVar28;
        }
        local_190 = 0;
        uStack_188 = 0x7a66;
        local_180 = 0;
        pcStack_178 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_170 = 0x65;
        LVar5.super_LineCol.col = 0;
        LVar5.super_LineCol.offset = SUB168(ZEXT816(0x7a66) << 0x40,0);
        LVar5.super_LineCol.line = SUB168(ZEXT816(0x7a66) << 0x40,8);
        LVar5.name.str =
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        LVar5.name.len = 0x65;
        (*(this->m_stack).m_callbacks.m_error)
                  ((char *)&local_1d8,0x45,LVar5,(this->m_stack).m_callbacks.m_user_data);
      }
    }
  }
  return cVar28;
}

Assistant:

csubstr Parser::_scan_squot_scalar()
{
    // quoted scalars can spread over multiple lines!
    // nice explanation here: http://yaml-multiline.info/

    // a span to the end of the file
    size_t b = m_state->pos.offset;
    substr s = m_buf.sub(b);
    if(s.begins_with(' '))
    {
        s = s.triml(' ');
        _RYML_CB_ASSERT(m_stack.m_callbacks, m_buf.sub(b).is_super(s));
        _RYML_CB_ASSERT(m_stack.m_callbacks, s.begin() >= m_buf.sub(b).begin());
        _line_progressed((size_t)(s.begin() - m_buf.sub(b).begin()));
    }
    b = m_state->pos.offset; // take this into account
    _RYML_CB_ASSERT(m_stack.m_callbacks, s.begins_with('\''));

    // skip the opening quote
    _line_progressed(1);
    s = s.sub(1);

    bool needs_filter = false;

    size_t numlines = 1; // we already have one line
    size_t pos = npos; // find the pos of the matching quote
    while( ! _finished_file())
    {
        const csubstr line = m_state->line_contents.rem;
        bool line_is_blank = true;
        _c4dbgpf("scanning single quoted scalar @ line[{}]: ~~~{}~~~", m_state->pos.line, line);
        for(size_t i = 0; i < line.len; ++i)
        {
            const char curr = line.str[i];
            if(curr == '\'') // single quotes are escaped with two single quotes
            {
                const char next = i+1 < line.len ? line.str[i+1] : '~';
                if(next != '\'') // so just look for the first quote
                {                // without another after it
                    pos = i;
                    break;
                }
                else
                {
                    needs_filter = true; // needs filter to remove escaped quotes
                    ++i; // skip the escaped quote
                }
            }
            else if(curr != ' ')
            {
                line_is_blank = false;
            }
        }

        // leading whitespace also needs filtering
        needs_filter = needs_filter
            || (numlines > 1)
            || line_is_blank
            || (_at_line_begin() && line.begins_with(' '));

        if(pos == npos)
        {
            _line_progressed(line.len);
            ++numlines;
        }
        else
        {
            _RYML_CB_ASSERT(m_stack.m_callbacks, pos >= 0 && pos < m_buf.len);
            _RYML_CB_ASSERT(m_stack.m_callbacks, m_buf[m_state->pos.offset + pos] == '\'');
            _line_progressed(pos + 1); // progress beyond the quote
            pos = m_state->pos.offset - b - 1; // but we stop before it
            break;
        }

        _line_ended();
        _scan_line();
    }

    if(pos == npos)
    {
        _c4err("reached end of file while looking for closing quote");
    }
    else
    {
        _RYML_CB_ASSERT(m_stack.m_callbacks, pos > 0);
        _RYML_CB_ASSERT(m_stack.m_callbacks, s.end() >= m_buf.begin() && s.end() <= m_buf.end());
        _RYML_CB_ASSERT(m_stack.m_callbacks, s.end() == m_buf.end() || *s.end() == '\'');
        s = s.sub(0, pos-1);
    }

    if(needs_filter)
    {
        csubstr ret = _filter_squot_scalar(s);
        _RYML_CB_ASSERT(m_stack.m_callbacks, ret.len <= s.len || s.empty() || s.trim(' ').empty());
        _c4dbgpf("final scalar: \"{}\"", ret);
        return ret;
    }

    _c4dbgpf("final scalar: \"{}\"", s);

    return s;
}